

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::WorldToLocal(positionTy *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  positionTy *in_RDI;
  
  if ((SUB21(in_RDI->f,1) >> 2 & 1) == 0) {
    pdVar4 = lat(in_RDI);
    dVar1 = *pdVar4;
    pdVar4 = lon(in_RDI);
    dVar2 = *pdVar4;
    pdVar4 = alt_m(in_RDI);
    dVar3 = *pdVar4;
    pdVar4 = X((positionTy *)0x12e8b0);
    pdVar5 = Y((positionTy *)0x12e8bf);
    pdVar6 = Z((positionTy *)0x12e8ce);
    XPLMWorldToLocal(dVar1,dVar2,dVar3,pdVar4,pdVar5,pdVar6);
    in_RDI->f = (posFlagsTy)((ushort)in_RDI->f & 0xfbff | 0x400);
  }
  return in_RDI;
}

Assistant:

positionTy& positionTy::WorldToLocal()
{
    if (f.unitCoord == UNIT_WORLD) {
        XPLMWorldToLocal(lat(), lon(), alt_m(),
                         &X(), &Y(), &Z());
        f.unitCoord = UNIT_LOCAL;
    }
    return *this;
}